

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_impl.h
# Opt level: O3

void __thiscall
SketchImpl<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>_>
::Deserialize(SketchImpl<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>_>
              *this,uchar *ptr)

{
  long lVar1;
  pointer puVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint *val;
  pointer puVar6;
  byte *pbVar7;
  uint val_1;
  uint uVar8;
  uint uVar9;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar6 = (this->m_syndromes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->m_syndromes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != puVar2) {
    uVar8 = 0;
    uVar4 = 0;
    do {
      do {
        uVar5 = uVar4;
        pbVar7 = ptr;
        bVar3 = (byte)uVar5 & 0x1f;
        uVar4 = uVar5 + 8;
        ptr = pbVar7 + 1;
        uVar8 = uVar8 | (uint)*pbVar7 << bVar3;
      } while ((int)uVar5 < 0x11);
      if (uVar4 < 0x20) {
        bVar3 = *ptr;
        ptr = pbVar7 + 2;
        uVar5 = uVar5 - 0x10;
        uVar9 = uVar8 | (uint)bVar3 << ((byte)uVar4 & 0x1f);
        uVar8 = (uint)(bVar3 >> (-(byte)uVar4 & 0x1f));
      }
      else {
        uVar5 = 0;
        uVar9 = uVar8;
        uVar8 = 0 << bVar3;
      }
      *puVar6 = uVar9;
      puVar6 = puVar6 + 1;
      uVar4 = uVar5;
    } while (puVar6 != puVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Deserialize(const unsigned char* ptr) override
    {
        BitReader reader(ptr);
        for (auto& val : m_syndromes) {
            val = m_field.Deserialize(reader);
        }
    }